

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeChangeToNoop(Vdbe *p,int addr)

{
  Op *pOVar1;
  int extraout_EAX;
  
  if (p->db->mallocFailed != '\0') {
    return (int)p;
  }
  pOVar1 = p->aOp;
  freeP4(p->db,(int)pOVar1[addr].p4type,pOVar1[addr].p4.p);
  pOVar1[addr].p4.p = (void *)0x0;
  pOVar1[addr].opcode = 0xbb;
  pOVar1[addr].p4type = '\0';
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeChangeToNoop(Vdbe *p, int addr){
  VdbeOp *pOp;
  if( p->db->mallocFailed ) return 0;
  assert( addr>=0 && addr<p->nOp );
  pOp = &p->aOp[addr];
  freeP4(p->db, pOp->p4type, pOp->p4.p);
  pOp->p4type = P4_NOTUSED;
  pOp->p4.z = 0;
  pOp->opcode = OP_Noop;
  return 1;
}